

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O3

void oonf_layer2_net_relabel
               (oonf_layer2_net *l2net,oonf_layer2_origin *new_origin,oonf_layer2_origin *old_origin
               )

{
  long lVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  
  lVar1 = 0x130;
  do {
    if (*(oonf_layer2_origin **)(l2net->name + lVar1) == old_origin) {
      *(oonf_layer2_origin **)(l2net->name + lVar1) = new_origin;
    }
    lVar1 = lVar1 + 0x28;
  } while (lVar1 != 0x3b0);
  lVar1 = 0x3b0;
  do {
    if (*(oonf_layer2_origin **)(l2net->name + lVar1) == old_origin) {
      *(oonf_layer2_origin **)(l2net->name + lVar1) = new_origin;
    }
    lVar1 = lVar1 + 0x28;
  } while (lVar1 != 0x7c0);
  plVar3 = (l2net->local_peer_ips).list_head.prev;
  for (plVar2 = (l2net->local_peer_ips).list_head.next; plVar2->prev != plVar3;
      plVar2 = plVar2->next) {
    if ((oonf_layer2_origin *)plVar2[-4].next == old_origin) {
      plVar2[-4].next = (list_entity *)new_origin;
      plVar3 = (l2net->local_peer_ips).list_head.prev;
    }
  }
  for (plVar2 = (l2net->neighbors).list_head.next; plVar2->prev != (l2net->neighbors).list_head.prev
      ; plVar2 = plVar2->next) {
    oonf_layer2_neigh_relabel((oonf_layer2_neigh *)(plVar2 + -0x4c),new_origin,old_origin);
  }
  return;
}

Assistant:

void
oonf_layer2_net_relabel(struct oonf_layer2_net *l2net, const struct oonf_layer2_origin *new_origin,
  const struct oonf_layer2_origin *old_origin) {
  struct oonf_layer2_neigh *l2neigh;
  struct oonf_layer2_peer_address *peer_ip;
  size_t i;

  for (i = 0; i < OONF_LAYER2_NET_COUNT; i++) {
    if (oonf_layer2_data_get_origin(&l2net->data[i]) == old_origin) {
      oonf_layer2_data_set_origin(&l2net->data[i], new_origin);
    }
  }

  for (i = 0; i < OONF_LAYER2_NEIGH_COUNT; i++) {
    if (oonf_layer2_data_get_origin(&l2net->neighdata[i]) == old_origin) {
      oonf_layer2_data_set_origin(&l2net->neighdata[i], new_origin);
    }
  }

  avl_for_each_element(&l2net->local_peer_ips, peer_ip, _net_node) {
    if (peer_ip->origin == old_origin) {
      peer_ip->origin = new_origin;
    }
  }

  avl_for_each_element(&l2net->neighbors, l2neigh, _node) {
    oonf_layer2_neigh_relabel(l2neigh, new_origin, old_origin);
  }
}